

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O1

void __thiscall
DIS::LinearObjectStatePdu::unmarshal(LinearObjectStatePdu *this,DataStream *dataStream)

{
  uchar *c;
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  ulong uVar4;
  LinearSegmentParameter x;
  LinearSegmentParameter LStack_98;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_objectID,dataStream);
  EntityID::unmarshal(&this->_referencedObjectID,dataStream);
  DataStream::operator>>(dataStream,&this->_updateNumber);
  DataStream::operator>>(dataStream,&this->_forceID);
  c = &this->_numberOfSegments;
  DataStream::operator>>(dataStream,c);
  SimulationAddress::unmarshal(&this->_requesterID,dataStream);
  SimulationAddress::unmarshal(&this->_receivingID,dataStream);
  ObjectType::unmarshal(&this->_objectType,dataStream);
  pLVar1 = (this->_linearSegmentParameters).
           super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->_linearSegmentParameters).
           super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar3 = pLVar1;
  if (pLVar2 != pLVar1) {
    do {
      (**pLVar3->_vptr_LinearSegmentParameter)(pLVar3);
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != pLVar2);
    (this->_linearSegmentParameters).
    super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar1;
  }
  if (*c != '\0') {
    uVar4 = 0;
    do {
      LinearSegmentParameter::LinearSegmentParameter(&LStack_98);
      LinearSegmentParameter::unmarshal(&LStack_98,dataStream);
      std::vector<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>::
      push_back(&this->_linearSegmentParameters,&LStack_98);
      LinearSegmentParameter::~LinearSegmentParameter(&LStack_98);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *c);
  }
  return;
}

Assistant:

void LinearObjectStatePdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _objectID.unmarshal(dataStream);
    _referencedObjectID.unmarshal(dataStream);
    dataStream >> _updateNumber;
    dataStream >> _forceID;
    dataStream >> _numberOfSegments;
    _requesterID.unmarshal(dataStream);
    _receivingID.unmarshal(dataStream);
    _objectType.unmarshal(dataStream);

     _linearSegmentParameters.clear();
     for(size_t idx = 0; idx < _numberOfSegments; idx++)
     {
        LinearSegmentParameter x;
        x.unmarshal(dataStream);
        _linearSegmentParameters.push_back(x);
     }
}